

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  Rtree *pRtree;
  RtreeNode *pNode;
  int iVar1;
  i64 iVar2;
  RtreeSearchPoint *pRVar3;
  sqlite3_vtab *psVar4;
  uint *__src;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  sqlite3_uint64 n;
  ulong uVar9;
  long in_FS_OFFSET;
  double dVar10;
  int local_84;
  i64 iNode;
  RtreeNode *pLeaf;
  int iCell;
  RtreeNode *pRoot;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRtree = (Rtree *)pVtabCursor->pVtab;
  pRoot = (RtreeNode *)0x0;
  iCell = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  resetCursor((RtreeCursor *)pVtabCursor);
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    pLeaf = (RtreeNode *)&DAT_aaaaaaaaaaaaaaaa;
    iVar2 = sqlite3VdbeIntValue(*argv);
    iNode = 0;
    iVar1 = sqlite3_value_numeric_type(*argv);
    if (iVar1 == 1) {
LAB_001d92c7:
      local_84 = findLeafNode(pRtree,iVar2,&pLeaf,&iNode);
      pNode = pLeaf;
      if (pLeaf != (RtreeNode *)0x0 && local_84 == 0) {
        pRVar3 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
        pVtabCursor[0xb].pVtab = (sqlite3_vtab *)pNode;
        pRVar3->id = iNode;
        pRVar3->eWithin = '\x01';
        local_84 = nodeRowidIndex(pRtree,pNode,iVar2,&iCell);
        pRVar3->iCell = (u8)iCell;
        goto LAB_001d9606;
      }
    }
    else {
      local_84 = 0;
      if (iVar1 == 2) {
        dVar10 = sqlite3VdbeRealValue(*argv);
        iVar1 = sqlite3IntFloatCompare(iVar2,dVar10);
        if (iVar1 == 0) goto LAB_001d92c7;
      }
    }
    *(undefined1 *)&pVtabCursor[1].pVtab = 1;
  }
  else {
    local_84 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&pRoot);
    if (argc < 1 || local_84 != 0) {
      if (local_84 == 0) goto LAB_001d95b5;
    }
    else {
      n = (ulong)(uint)argc * 0x18;
      psVar4 = (sqlite3_vtab *)sqlite3_malloc64(n);
      pVtabCursor[3].pVtab = psVar4;
      *(int *)&pVtabCursor[2].pVtab = argc;
      local_84 = 7;
      if (psVar4 != (sqlite3_vtab *)0x0) {
        lVar8 = 0;
        memset(psVar4,0,n);
        memset(pVtabCursor + 0x10,0,(long)pRtree->iDepth * 4 + 4);
        for (uVar9 = 0; (uint)argc != uVar9; uVar9 = uVar9 + 1) {
          psVar4 = pVtabCursor[3].pVtab;
          iVar1 = sqlite3_value_numeric_type(argv[uVar9]);
          uVar7 = (uint)idxStr[uVar9 * 2];
          *(uint *)((long)&psVar4->pModule + lVar8 + 4) = uVar7;
          *(int *)((long)&psVar4->pModule + lVar8) = idxStr[uVar9 * 2 + 1] + -0x30;
          if ((int)uVar7 < 0x46) {
            if (iVar1 == 2) {
              dVar10 = sqlite3VdbeRealValue(argv[uVar9]);
              *(double *)((long)&psVar4->nRef + lVar8) = dVar10;
            }
            else if (iVar1 == 1) {
              iVar2 = sqlite3VdbeIntValue(argv[uVar9]);
              *(double *)((long)&psVar4->nRef + lVar8) = (double)iVar2;
              if (iVar2 - 0x1000000000000U < 0xfffe000000000001) {
                iVar1 = *(int *)((long)&psVar4->pModule + lVar8 + 4);
                if (iVar1 == 0x45) {
                  *(undefined4 *)((long)&psVar4->pModule + lVar8 + 4) = 0x44;
                }
                else if (iVar1 == 0x43) {
                  *(undefined4 *)((long)&psVar4->pModule + lVar8 + 4) = 0x42;
                }
              }
            }
            else {
              *(undefined8 *)((long)&psVar4->nRef + lVar8) = 0;
              if ((iVar1 == 5) || ((uVar7 & 0xfffffffe) != 0x42)) {
                *(undefined4 *)((long)&psVar4->pModule + lVar8 + 4) = 0x40;
              }
              else {
                *(undefined4 *)((long)&psVar4->pModule + lVar8 + 4) = 0x3f;
              }
            }
          }
          else {
            __src = (uint *)sqlite3_value_pointer(argv[uVar9],"RtreeMatchArg");
            if (__src == (uint *)0x0) {
              local_84 = 1;
              goto LAB_001d9606;
            }
            puVar5 = (undefined8 *)sqlite3_malloc64((ulong)*__src + 0x70);
            if (puVar5 == (undefined8 *)0x0) goto LAB_001d9606;
            puVar5[0xc] = 0;
            puVar5[0xd] = 0;
            puVar5[10] = 0;
            puVar5[0xb] = 0;
            puVar5[8] = 0;
            puVar5[9] = 0;
            puVar5[6] = 0;
            puVar5[7] = 0;
            puVar5[4] = 0;
            puVar5[5] = 0;
            puVar5[2] = 0;
            puVar5[3] = 0;
            *puVar5 = 0;
            puVar5[1] = 0;
            memcpy(puVar5 + 0xe,__src,(ulong)*__src);
            lVar6 = puVar5[0xf];
            *puVar5 = puVar5[0x12];
            *(undefined4 *)(puVar5 + 1) = *(undefined4 *)(puVar5 + 0x13);
            puVar5[2] = puVar5 + 0x15;
            puVar5[0xd] = puVar5[0x14];
            if (lVar6 == 0) {
              *(undefined4 *)((long)&psVar4->pModule + lVar8 + 4) = 0x47;
              lVar6 = puVar5[0x10];
            }
            *(long *)((long)&psVar4->nRef + lVar8) = lVar6;
            *(undefined8 **)((long)&psVar4->zErrMsg + lVar8) = puVar5;
            *(uint *)(puVar5 + 7) = (uint)pRtree->nDim2;
            puVar5[6] = pVtabCursor + 0x10;
            *(int *)(puVar5 + 8) = pRtree->iDepth + 1;
          }
          lVar8 = lVar8 + 0x18;
        }
LAB_001d95b5:
        pRVar3 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
        if (pRVar3 == (RtreeSearchPoint *)0x0) {
          local_84 = 7;
          goto LAB_001d9624;
        }
        pRVar3->id = 1;
        pRVar3->eWithin = '\x01';
        pRVar3->iCell = '\0';
        pVtabCursor[0xb].pVtab = (sqlite3_vtab *)pRoot;
        pRoot = (RtreeNode *)0x0;
        local_84 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
      }
    }
  }
LAB_001d9606:
  nodeRelease(pRtree,pRoot);
  rtreeRelease(pRtree);
LAB_001d9624:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_84;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    int eType = sqlite3_value_numeric_type(argv[0]);
    if( eType==SQLITE_INTEGER
     || (eType==SQLITE_FLOAT
         && 0==sqlite3IntFloatCompare(iRowid,sqlite3_value_double(argv[0])))
    ){
      rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    }else{
      rc = SQLITE_OK;
      pLeaf = 0;
    }
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          int eType = sqlite3_value_numeric_type(argv[ii]);
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else if( eType==SQLITE_INTEGER ){
            sqlite3_int64 iVal = sqlite3_value_int64(argv[ii]);
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = iVal;
#else
            p->u.rValue = (double)iVal;
            if( iVal>=((sqlite3_int64)1)<<48
             || iVal<=-(((sqlite3_int64)1)<<48)
            ){
              if( p->op==RTREE_LT ) p->op = RTREE_LE;
              if( p->op==RTREE_GT ) p->op = RTREE_GE;
            }
#endif
          }else if( eType==SQLITE_FLOAT ){
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }else{
            p->u.rValue = RTREE_ZERO;
            if( eType==SQLITE_NULL ){
              p->op = RTREE_FALSE;
            }else if( p->op==RTREE_LT || p->op==RTREE_LE ){
              p->op = RTREE_TRUE;
            }else{
              p->op = RTREE_FALSE;
            }
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      assert( pCsr->bPoint==0 );  /* Due to the resetCursor() call above */
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( NEVER(pNew==0) ){       /* Because pCsr->bPoint was FALSE */
        return SQLITE_NOMEM;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}